

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O3

bool __thiscall
LTWeatherVisitor::visitTemperatureGroup
          (LTWeatherVisitor *this,TemperatureGroup *tg,ReportPart param_2,string *param_3)

{
  uint uVar1;
  uint uVar2;
  _Optional_payload_base<int> _Var3;
  float fVar4;
  
  if (tg->tp == TEMPERATURE_AND_DEW_POINT) {
    _Var3 = (tg->t).tempValue.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>;
    if (((ulong)_Var3 >> 0x20 & 1) != 0) {
      uVar1._0_1_ = (tg->t).freezing;
      uVar1._1_1_ = (tg->t).precise;
      uVar1._2_2_ = *(undefined2 *)&(tg->t).field_0xa;
      fVar4 = (float)_Var3._M_payload._M_value;
      if ((uVar1 >> 8 & 1) != 0) {
        fVar4 = fVar4 * 0.1;
      }
      LTWeather::FillUp(&this->w->temperature_altitude_msl_m,&this->w->temperatures_aloft_deg_c,
                        this->fieldAlt_m,fVar4,true);
    }
    _Var3 = (tg->dp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>;
    if (((ulong)_Var3 & 0x100000000) != 0) {
      uVar2._0_1_ = (tg->dp).freezing;
      uVar2._1_1_ = (tg->dp).precise;
      uVar2._2_2_ = *(undefined2 *)&(tg->dp).field_0xa;
      fVar4 = (float)_Var3._M_payload._M_value;
      if ((uVar2 >> 8 & 1) != 0) {
        fVar4 = fVar4 * 0.1;
      }
      LTWeather::FillUp(&this->w->temperature_altitude_msl_m,&this->w->dewpoint_deg_c,
                        this->fieldAlt_m,fVar4,true);
    }
  }
  return false;
}

Assistant:

bool visitTemperatureGroup(const TemperatureGroup& tg,
                               ReportPart, const std::string&) override
    {
        if (tg.type() == TemperatureGroup::Type::TEMPERATURE_AND_DEW_POINT) {
            // Temperatur: Fill the same temp all the way up to field altitude, which wouldn't be quite right...but under us is ground anyway
            if (tg.airTemperature().temperature().has_value())
                w.FillUp(w.temperature_altitude_msl_m, w.temperatures_aloft_deg_c,
                         fieldAlt_m,
                         tg.airTemperature().toUnit(Temperature::Unit::C).value_or(NAN),
                         true);
            // Dew Point: Fill the same temp all the way up to field altitude, which wouldn't be quite right...but under us is ground anyway
            if (tg.dewPoint().temperature().has_value())
                w.FillUp(w.temperature_altitude_msl_m, w.dewpoint_deg_c,
                         fieldAlt_m,
                         tg.dewPoint().toUnit(Temperature::Unit::C).value_or(NAN),
                         true);
        }
        return false;
    }